

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Token * __thiscall wabt::WastParser::Consume(Token *__return_storage_ptr__,WastParser *this)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  TokenType TVar7;
  undefined4 uVar8;
  Token *pTVar9;
  
  if ((this->tokens_).tokens._M_elems[(this->tokens_).i].
      super__Optional_base<wabt::Token,_true,_true>._M_payload.
      super__Optional_payload_base<wabt::Token>._M_engaged != false) {
    pTVar9 = TokenQueue::front(&this->tokens_);
    pcVar1 = (pTVar9->loc).filename._M_str;
    sVar2 = (pTVar9->loc).field_1.field_1.offset;
    uVar3 = *(undefined8 *)((long)&(pTVar9->loc).field_1 + 8);
    TVar7 = pTVar9->token_type_;
    uVar8 = *(undefined4 *)&pTVar9->field_0x24;
    sVar4 = (pTVar9->field_2).text_._M_len;
    pcVar5 = (pTVar9->field_2).text_._M_str;
    pcVar6 = (pTVar9->field_2).literal_.text._M_str;
    (__return_storage_ptr__->loc).filename._M_len = (pTVar9->loc).filename._M_len;
    (__return_storage_ptr__->loc).filename._M_str = pcVar1;
    (__return_storage_ptr__->loc).field_1.field_1.offset = sVar2;
    *(undefined8 *)((long)&(__return_storage_ptr__->loc).field_1 + 8) = uVar3;
    __return_storage_ptr__->token_type_ = TVar7;
    *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar8;
    (__return_storage_ptr__->field_2).text_._M_len = sVar4;
    (__return_storage_ptr__->field_2).text_._M_str = pcVar5;
    (__return_storage_ptr__->field_2).literal_.text._M_str = pcVar6;
    TokenQueue::pop_front(&this->tokens_);
    return __return_storage_ptr__;
  }
  __assert_fail("!tokens_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                ,0x29c,"Token wabt::WastParser::Consume()");
}

Assistant:

bool WastParser::TokenQueue::empty() const {
  return !tokens[i];
}